

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O0

bool __thiscall
pbrt::Bounds3<float>::IntersectP
          (Bounds3<float> *this,Point3f *o,Vector3f *d,Float raytMax,Vector3f *invDir,int *dirIsNeg)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  Point3<float> *pPVar7;
  float *in_RCX;
  float *in_RSI;
  Bounds3<float> *in_RDI;
  int *in_R8;
  float in_XMM0_Da;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  Float tzMax;
  Float tzMin;
  Float tyMax;
  Float tyMin;
  Float tMax;
  Float tMin;
  Bounds3f *bounds;
  bool local_59;
  float local_48;
  float local_44;
  bool local_1;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  pPVar7 = operator[](in_RDI,*in_R8);
  local_44 = ((pPVar7->super_Tuple3<pbrt::Point3,_float>).x - *in_RSI) * *in_RCX;
  pPVar7 = operator[](in_RDI,1 - *in_R8);
  fVar1 = (pPVar7->super_Tuple3<pbrt::Point3,_float>).x;
  fVar2 = *in_RSI;
  fVar3 = *in_RCX;
  pPVar7 = operator[](in_RDI,in_R8[1]);
  fVar4 = ((pPVar7->super_Tuple3<pbrt::Point3,_float>).y - in_RSI[1]) * in_RCX[1];
  pPVar7 = operator[](in_RDI,1 - in_R8[1]);
  fVar5 = ((pPVar7->super_Tuple3<pbrt::Point3,_float>).y - in_RSI[1]) * in_RCX[1];
  auVar8._0_8_ = pbrt::gamma((double)(ulong)(uint)fVar5);
  auVar8._8_56_ = extraout_var;
  auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),auVar8._0_16_,
                           SUB6416(ZEXT464(0x3f800000),0));
  local_48 = auVar6._0_4_ * (fVar1 - fVar2) * fVar3;
  auVar9._0_8_ = pbrt::gamma((double)(ulong)(uint)local_48);
  auVar9._8_56_ = extraout_var_00;
  auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),auVar9._0_16_,
                           SUB6416(ZEXT464(0x3f800000),0));
  fVar5 = auVar6._0_4_ * fVar5;
  if ((fVar5 < local_44) || (local_48 < fVar4)) {
    local_1 = false;
  }
  else {
    if (local_44 < fVar4) {
      local_44 = fVar4;
    }
    if (fVar5 < local_48) {
      local_48 = fVar5;
    }
    pPVar7 = operator[](in_RDI,in_R8[2]);
    fVar1 = ((pPVar7->super_Tuple3<pbrt::Point3,_float>).z - in_RSI[2]) * in_RCX[2];
    pPVar7 = operator[](in_RDI,1 - in_R8[2]);
    fVar2 = ((pPVar7->super_Tuple3<pbrt::Point3,_float>).z - in_RSI[2]) * in_RCX[2];
    auVar10._0_8_ = pbrt::gamma((double)(ulong)(uint)fVar2);
    auVar10._8_56_ = extraout_var_01;
    auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),auVar10._0_16_,
                             SUB6416(ZEXT464(0x3f800000),0));
    fVar2 = auVar6._0_4_ * fVar2;
    if ((fVar2 < local_44) || (local_48 < fVar1)) {
      local_1 = false;
    }
    else {
      if (local_44 < fVar1) {
        local_44 = fVar1;
      }
      if (fVar2 < local_48) {
        local_48 = fVar2;
      }
      local_59 = local_44 < in_XMM0_Da && 0.0 < local_48;
      local_1 = local_59;
    }
  }
  return local_1;
}

Assistant:

PBRT_CPU_GPU inline bool Bounds3<T>::IntersectP(const Point3f &o, const Vector3f &d,
                                                Float raytMax, const Vector3f &invDir,
                                                const int dirIsNeg[3]) const {
    const Bounds3f &bounds = *this;
    // Check for ray intersection against $x$ and $y$ slabs
    Float tMin = (bounds[dirIsNeg[0]].x - o.x) * invDir.x;
    Float tMax = (bounds[1 - dirIsNeg[0]].x - o.x) * invDir.x;
    Float tyMin = (bounds[dirIsNeg[1]].y - o.y) * invDir.y;
    Float tyMax = (bounds[1 - dirIsNeg[1]].y - o.y) * invDir.y;
    // Update _tMax_ and _tyMax_ to ensure robust bounds intersection
    tMax *= 1 + 2 * gamma(3);
    tyMax *= 1 + 2 * gamma(3);

    if (tMin > tyMax || tyMin > tMax)
        return false;
    if (tyMin > tMin)
        tMin = tyMin;
    if (tyMax < tMax)
        tMax = tyMax;

    // Check for ray intersection against $z$ slab
    Float tzMin = (bounds[dirIsNeg[2]].z - o.z) * invDir.z;
    Float tzMax = (bounds[1 - dirIsNeg[2]].z - o.z) * invDir.z;
    // Update _tzMax_ to ensure robust bounds intersection
    tzMax *= 1 + 2 * gamma(3);

    if (tMin > tzMax || tzMin > tMax)
        return false;
    if (tzMin > tMin)
        tMin = tzMin;
    if (tzMax < tMax)
        tMax = tzMax;

    return (tMin < raytMax) && (tMax > 0);
}